

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_key.c
# Opt level: O3

int write_private_key(mbedtls_pk_context *key,char *output_file)

{
  uint uVar1;
  size_t __n;
  FILE *__s;
  size_t sVar2;
  int iVar3;
  uchar *__ptr;
  uchar output_buf [16000];
  uchar auStack_3ea8 [16000];
  undefined1 auStack_28 [8];
  
  __ptr = auStack_3ea8;
  memset(auStack_3ea8,0,16000);
  if (opt.format == 0) {
    iVar3 = mbedtls_pk_write_key_pem(key,auStack_3ea8,16000);
    if (iVar3 != 0) {
      return iVar3;
    }
    __n = strlen((char *)auStack_3ea8);
  }
  else {
    uVar1 = mbedtls_pk_write_key_der(key,auStack_3ea8,16000);
    if ((int)uVar1 < 0) {
      return uVar1;
    }
    __n = (size_t)uVar1;
    __ptr = auStack_28 + -__n;
  }
  __s = fopen(output_file,"wb");
  if (__s == (FILE *)0x0) {
    iVar3 = -1;
  }
  else {
    sVar2 = fwrite(__ptr,1,__n,__s);
    fclose(__s);
    iVar3 = -(uint)(sVar2 != __n);
  }
  return iVar3;
}

Assistant:

static int write_private_key( mbedtls_pk_context *key, const char *output_file )
{
    int ret;
    FILE *f;
    unsigned char output_buf[16000];
    unsigned char *c = output_buf;
    size_t len = 0;

    memset(output_buf, 0, 16000);
    if( opt.format == FORMAT_PEM )
    {
        if( ( ret = mbedtls_pk_write_key_pem( key, output_buf, 16000 ) ) != 0 )
            return( ret );

        len = strlen( (char *) output_buf );
    }
    else
    {
        if( ( ret = mbedtls_pk_write_key_der( key, output_buf, 16000 ) ) < 0 )
            return( ret );

        len = ret;
        c = output_buf + sizeof(output_buf) - len;
    }

    if( ( f = fopen( output_file, "wb" ) ) == NULL )
        return( -1 );

    if( fwrite( c, 1, len, f ) != len )
    {
        fclose( f );
        return( -1 );
    }

    fclose( f );

    return( 0 );
}